

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

void __thiscall
QFileSystemModelPrivate::sortChildren(QFileSystemModelPrivate *this,int column,QModelIndex *parent)

{
  QList<QString> *this_00;
  QFileSystemNode *pQVar1;
  long *plVar2;
  QString *args;
  QFileSystemNode **ppQVar3;
  Span *pSVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  iterator __first;
  iterator __last;
  QFileSystemNode *pQVar8;
  Span *pSVar9;
  Span *pSVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  Data *pDVar14;
  long in_FS_OFFSET;
  QFileSystemModelSorter __comp;
  QModelIndex local_98;
  QList<QFileSystemModelPrivate::QFileSystemNode_*> local_78;
  undefined1 local_58 [8];
  undefined4 local_50;
  QCollator local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->root;
  pQVar8 = pQVar1;
  if ((parent->m).ptr != (QAbstractItemModel *)0x0) {
    pQVar8 = (QFileSystemNode *)parent->i;
  }
  if ((parent->c | parent->r) < 0) {
    pQVar8 = pQVar1;
  }
  pDVar14 = (pQVar8->children).d;
  if ((pDVar14 == (Data *)0x0) || (pDVar14->size == 0)) goto LAB_006134d0;
  plVar2 = *(long **)&this->field_0x8;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (QFileSystemNode **)0x0;
  local_78.d.size = 0;
  if (pDVar14->spans->offsets[0] == 0xff) {
    pSVar4 = (Span *)0x1;
    do {
      pSVar9 = pSVar4;
      if ((Span *)pDVar14->numBuckets == pSVar9) {
        pDVar14 = (Data *)0x0;
        pSVar10 = (Span *)0x0;
        break;
      }
      pSVar4 = (Span *)(pSVar9->offsets + 1);
      pSVar10 = pSVar9;
    } while (pDVar14->spans[(ulong)pSVar9 >> 7].offsets[(uint)pSVar9 & 0x7f] == 0xff);
    if (pDVar14 != (Data *)0x0 || pSVar10 != (Span *)0x0) goto LAB_00613238;
  }
  else {
    pSVar10 = (Span *)0x0;
LAB_00613238:
    do {
      lVar11 = ((ulong)pSVar10 >> 3 & 0xfffffffffffffff0) * 9;
      uVar12 = (ulong)((uint)pSVar10 & 0x7f);
      bVar5 = filtersAcceptsNode(this,*(QFileSystemNode **)
                                       (*(long *)(pDVar14->spans->offsets + lVar11 + 0x80) + 0x18 +
                                       (ulong)pDVar14->spans->offsets[uVar12 + lVar11] * 0x20));
      pSVar9 = *(Span **)(*(long *)(pDVar14->spans->offsets + lVar11 + 0x80) + 0x18 +
                         (ulong)pDVar14->spans->offsets[uVar12 + lVar11] * 0x20);
      if (bVar5) {
        local_98._0_8_ = pSVar9;
        QtPrivate::QPodArrayOps<QFileSystemModelPrivate::QFileSystemNode*>::
        emplace<QFileSystemModelPrivate::QFileSystemNode*&>
                  ((QPodArrayOps<QFileSystemModelPrivate::QFileSystemNode*> *)&local_78,
                   local_78.d.size,(QFileSystemNode **)&local_98);
        QList<QFileSystemModelPrivate::QFileSystemNode_*>::end(&local_78);
      }
      else {
        pSVar9->offsets[0x4d] = '\0';
      }
      do {
        if ((Span *)(pDVar14->numBuckets - 1) == pSVar10) {
          pDVar14 = (Data *)0x0;
          pSVar10 = (Span *)0x0;
          break;
        }
        pSVar10 = (Span *)(pSVar10->offsets + 1);
        pSVar9 = pDVar14->spans + ((ulong)pSVar10 >> 7);
      } while (pSVar9->offsets[(uint)pSVar10 & 0x7f] == 0xff);
    } while ((pDVar14 != (Data *)0x0) || (pSVar10 != (Span *)0x0));
  }
  local_48.d = (QCollatorPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QCollator::QCollator(&local_48);
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,column);
  QCollator::setNumericMode(SUB81(&local_48,0));
  QCollator::setCaseSensitivity((CaseSensitivity)&local_48);
  __first = QList<QFileSystemModelPrivate::QFileSystemNode_*>::begin(&local_78);
  __last = QList<QFileSystemModelPrivate::QFileSystemNode_*>::end(&local_78);
  QCollator::QCollator((QCollator *)local_58,&local_48);
  local_50 = puStack_40._0_4_;
  __comp._8_8_ = pSVar9;
  __comp.naturalCompare.d = (QCollatorPrivate *)local_58;
  std::sort<QList<QFileSystemModelPrivate::QFileSystemNode*>::iterator,QFileSystemModelSorter>
            (__first,__last,__comp);
  QCollator::~QCollator((QCollator *)local_58);
  this_00 = &pQVar8->visibleChildren;
  QList<QString>::clear(this_00);
  pQVar8->dirtyChildrenIndex = -1;
  QList<QString>::reserve(this_00,local_78.d.size);
  ppQVar3 = local_78.d.ptr;
  if (local_78.d.size != 0) {
    lVar11 = local_78.d.size << 3;
    lVar13 = 0;
    do {
      args = *(QString **)((long)ppQVar3 + lVar13);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)this_00,(pQVar8->visibleChildren).d.size,args);
      QList<QString>::end(this_00);
      *(undefined1 *)((long)&args[3].d.d + 5) = 1;
      lVar13 = lVar13 + 8;
    } while (lVar11 != lVar13);
  }
  if ((this->disableRecursiveSort == false) &&
     (iVar6 = (**(code **)(*plVar2 + 0x78))(plVar2,parent), 0 < iVar6)) {
    iVar6 = 0;
    do {
      local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98.i._0_4_ = 0xaaaaaaaa;
      local_98.i._4_4_ = 0xaaaaaaaa;
      (**(code **)(*plVar2 + 0x60))(&local_98,plVar2,iVar6,0,parent);
      pQVar8 = pQVar1;
      if (local_98.m.ptr != (QAbstractItemModel *)0x0) {
        pQVar8 = (QFileSystemNode *)CONCAT44(local_98.i._4_4_,(undefined4)local_98.i);
      }
      if ((local_98.c | local_98.r) < 0) {
        pQVar8 = pQVar1;
      }
      if (pQVar8->isVisible == true) {
        sortChildren(this,column,&local_98);
      }
      iVar6 = iVar6 + 1;
      iVar7 = (**(code **)(*plVar2 + 0x78))(plVar2,parent);
    } while (iVar6 < iVar7);
  }
  QCollator::~QCollator(&local_48);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
    }
  }
LAB_006134d0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModelPrivate::sortChildren(int column, const QModelIndex &parent)
{
    Q_Q(QFileSystemModel);
    QFileSystemModelPrivate::QFileSystemNode *indexNode = node(parent);
    if (indexNode->children.size() == 0)
        return;

    QList<QFileSystemModelPrivate::QFileSystemNode *> values;

    for (auto iterator = indexNode->children.constBegin(), cend = indexNode->children.constEnd(); iterator != cend; ++iterator) {
        if (filtersAcceptsNode(iterator.value())) {
            values.append(iterator.value());
        } else {
            iterator.value()->isVisible = false;
        }
    }
    QFileSystemModelSorter ms(column);
    std::sort(values.begin(), values.end(), ms);
    // First update the new visible list
    indexNode->visibleChildren.clear();
    //No more dirty item we reset our internal dirty index
    indexNode->dirtyChildrenIndex = -1;
    indexNode->visibleChildren.reserve(values.size());
    for (QFileSystemNode *node : std::as_const(values)) {
        indexNode->visibleChildren.append(node->fileName);
        node->isVisible = true;
    }

    if (!disableRecursiveSort) {
        for (int i = 0; i < q->rowCount(parent); ++i) {
            const QModelIndex childIndex = q->index(i, 0, parent);
            QFileSystemModelPrivate::QFileSystemNode *indexNode = node(childIndex);
            //Only do a recursive sort on visible nodes
            if (indexNode->isVisible)
                sortChildren(column, childIndex);
        }
    }
}